

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

Ptr * __thiscall
wabt::interp::Instance::Instantiate
          (Ptr *__return_storage_ptr__,Instance *this,Store *store,Ref module,RefVec *imports,
          Ptr *out_trap)

{
  u32 uVar1;
  bool bVar2;
  Result result_00;
  u32 uVar3;
  Module *pMVar4;
  ModuleDesc *pMVar5;
  value_type *pvVar6;
  const_reference pvVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Extern *pEVar10;
  Instance *pIVar11;
  pointer pEVar12;
  Instance *this_00;
  Features *this_01;
  reference this_02;
  ElemDesc *pEVar13;
  Table *pTVar14;
  ulong uVar15;
  reference this_03;
  DataDesc *pDVar16;
  reference pvVar17;
  Memory *pMVar18;
  Func *this_04;
  Value VVar19;
  vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> local_688;
  Enum local_66c;
  undefined1 local_668 [8];
  Values results;
  undefined1 local_648 [8];
  Ptr func;
  StartDesc *start;
  const_iterator __end2_8;
  const_iterator __begin2_8;
  vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_> *__range2_8;
  string local_5f8;
  Ptr local_5d8;
  Enum local_5bc;
  Enum local_5b8;
  Result local_5b4;
  undefined8 local_5b0;
  u64 local_5a8;
  undefined8 local_5a0;
  Value local_598;
  u32 local_584;
  Ref RStack_580;
  u32 offset_1;
  undefined1 local_578 [8];
  Ptr memory;
  Result result_1;
  DataDesc *desc_9;
  DataSegment *segment_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_> *__range3_1;
  string local_518;
  Ptr local_4f8;
  Enum local_4dc;
  Enum local_4d8;
  Result local_4d4;
  undefined8 local_4d0;
  u64 local_4c8;
  undefined8 local_4c0;
  Value local_4b8;
  u32 local_4a4;
  Ref RStack_4a0;
  u32 offset;
  undefined1 local_498 [8];
  Ptr table;
  Result result;
  ElemDesc *desc_8;
  ElemSegment *segment;
  iterator __end3;
  iterator __begin3;
  vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_> *__range3;
  reference pDStack_448;
  int pass;
  reference local_440;
  DataDesc *desc_7;
  const_iterator __end2_7;
  const_iterator __begin2_7;
  vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_> *__range2_7;
  reference local_418;
  ElemDesc *desc_6;
  const_iterator __end2_6;
  const_iterator __begin2_6;
  vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_> *__range2_6;
  Ref ref;
  ExportDesc *desc_5;
  const_iterator __end2_5;
  const_iterator __begin2_5;
  vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_> *__range2_5;
  Ptr local_3a8;
  value_type local_390;
  EventType *local_388;
  EventDesc *desc_4;
  const_iterator __end2_4;
  const_iterator __begin2_4;
  vector<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_> *__range2_4;
  GlobalType *local_350;
  undefined8 local_348;
  undefined1 local_340 [64];
  GlobalDesc *desc_3;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_> *__range2_3;
  Ptr local_2c0;
  value_type local_2a8;
  MemoryType *local_2a0;
  MemoryDesc *desc_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_> *__range2_2;
  Ptr local_258;
  value_type local_240;
  TableType *local_238;
  TableDesc *desc_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_> *__range2_1;
  Ref local_1b8;
  Ptr local_1b0;
  value_type local_198;
  reference local_190;
  FuncDesc *desc;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_> *__range2;
  undefined1 local_160 [8];
  Ptr extern_;
  string local_130;
  Ptr local_110;
  size_t local_f8;
  size_t local_f0;
  Ref local_e8;
  Ref extern_ref;
  value_type *import_desc;
  size_t i;
  vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> local_c8;
  allocator local_a9;
  string local_a8;
  Ptr local_88;
  value_type *local_70;
  size_t import_desc_count;
  Ptr inst;
  undefined1 local_48 [8];
  Ptr mod;
  Ptr *out_trap_local;
  RefVec *imports_local;
  Store *store_local;
  Ref module_local;
  
  inst.root_index_ = (Index)store;
  mod.root_index_ = (Index)imports;
  store_local = store;
  module_local.index = (size_t)__return_storage_ptr__;
  RefPtr<wabt::interp::Module>::RefPtr
            ((RefPtr<wabt::interp::Module> *)local_48,(Store *)this,(Ref)store);
  Store::Alloc<wabt::interp::Instance,wabt::interp::Store&,wabt::interp::Ref&>
            ((RefPtr<wabt::interp::Instance> *)&import_desc_count,(Store *)this,(Store *)this,
             (Ref *)&store_local);
  pMVar4 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
  pMVar5 = Module::desc(pMVar4);
  local_70 = (value_type *)
             std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::size
                       (&pMVar5->imports);
  pvVar6 = (value_type *)
           std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::size
                     ((vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)module.index)
  ;
  if (pvVar6 < local_70) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a8,"not enough imports!",&local_a9);
    memset(&local_c8,0,0x18);
    std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::vector(&local_c8);
    Trap::New(&local_88,(Store *)this,&local_a8,&local_c8);
    RefPtr<wabt::interp::Trap>::operator=((RefPtr<wabt::interp::Trap> *)mod.root_index_,&local_88);
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_88);
    std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::~vector(&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    RefPtr<wabt::interp::Instance>::RefPtr(__return_storage_ptr__);
  }
  else {
    for (import_desc = (value_type *)0x0; import_desc < local_70;
        import_desc = (value_type *)&(import_desc->type).module.field_0x1) {
      pMVar4 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
      pMVar5 = Module::desc(pMVar4);
      extern_ref.index =
           (size_t)std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                   ::operator[](&pMVar5->imports,(size_type)import_desc);
      pvVar7 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                         ((vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)
                          module.index,(size_type)import_desc);
      local_f0 = pvVar7->index;
      local_f8 = Ref::Null.index;
      local_e8.index = local_f0;
      bVar2 = interp::operator==((Ref)local_f0,Ref::Null);
      if (bVar2) {
        uVar8 = std::__cxx11::string::c_str();
        uVar9 = std::__cxx11::string::c_str();
        StringPrintf_abi_cxx11_(&local_130,"invalid import \"%s.%s\"",uVar8,uVar9);
        memset(&extern_.root_index_,0,0x18);
        std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::vector
                  ((vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                   &extern_.root_index_);
        Trap::New(&local_110,(Store *)this,&local_130,
                  (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                  &extern_.root_index_);
        RefPtr<wabt::interp::Trap>::operator=
                  ((RefPtr<wabt::interp::Trap> *)mod.root_index_,&local_110);
        RefPtr<wabt::interp::Trap>::~RefPtr(&local_110);
        std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::~vector
                  ((vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                   &extern_.root_index_);
        std::__cxx11::string::~string((string *)&local_130);
        RefPtr<wabt::interp::Instance>::RefPtr(__return_storage_ptr__);
        goto LAB_0045f16b;
      }
      RefPtr<wabt::interp::Extern>::RefPtr
                ((RefPtr<wabt::interp::Extern> *)local_160,(Store *)this,local_e8);
      pEVar10 = RefPtr<wabt::interp::Extern>::operator->((RefPtr<wabt::interp::Extern> *)local_160);
      result_00.enum_ =
           (*(pEVar10->super_Object)._vptr_Object[3])(pEVar10,this,extern_ref.index,mod.root_index_)
      ;
      bVar2 = Failed(result_00);
      if (bVar2) {
        RefPtr<wabt::interp::Instance>::RefPtr(__return_storage_ptr__);
        bVar2 = true;
      }
      else {
        pIVar11 = RefPtr<wabt::interp::Instance>::operator->
                            ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
        std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                  (&pIVar11->imports_,&local_e8);
        pEVar12 = std::
                  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                  ::operator->((unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                                *)(extern_ref.index + 0x40));
        switch(pEVar12->kind) {
        case First:
          pIVar11 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                    (&pIVar11->funcs_,&local_e8);
          break;
        case Table:
          pIVar11 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                    (&pIVar11->tables_,&local_e8);
          break;
        case Memory:
          pIVar11 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                    (&pIVar11->memories_,&local_e8);
          break;
        case Global:
          pIVar11 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                    (&pIVar11->globals_,&local_e8);
          break;
        case Event:
          pIVar11 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                    (&pIVar11->events_,&local_e8);
        }
        bVar2 = false;
      }
      RefPtr<wabt::interp::Extern>::~RefPtr((RefPtr<wabt::interp::Extern> *)local_160);
      if (bVar2) goto LAB_0045f16b;
    }
    pMVar4 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar5 = Module::desc(pMVar4);
    __end2 = std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::begin
                       (&pMVar5->funcs);
    desc = (FuncDesc *)
           std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::end
                     (&pMVar5->funcs);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_wabt::interp::FuncDesc_*,_std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>_>
                                       *)&desc), bVar2) {
      local_190 = __gnu_cxx::
                  __normal_iterator<const_wabt::interp::FuncDesc_*,_std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>_>
                  ::operator*(&__end2);
      pIVar11 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      local_1b8 = RefPtr<wabt::interp::Instance>::ref
                            ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      FuncDesc::FuncDesc((FuncDesc *)&__range2_1,local_190);
      DefinedFunc::New(&local_1b0,(Store *)this,local_1b8,(FuncDesc *)&__range2_1);
      local_198.index = (size_t)RefPtr<wabt::interp::DefinedFunc>::ref(&local_1b0);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (&pIVar11->funcs_,&local_198);
      RefPtr<wabt::interp::DefinedFunc>::~RefPtr(&local_1b0);
      FuncDesc::~FuncDesc((FuncDesc *)&__range2_1);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::FuncDesc_*,_std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>_>
      ::operator++(&__end2);
    }
    pMVar4 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar5 = Module::desc(pMVar4);
    __end2_1 = std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>::begin
                         (&pMVar5->tables);
    desc_1 = (TableDesc *)
             std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>::end
                       (&pMVar5->tables);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<const_wabt::interp::TableDesc_*,_std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>_>
                               *)&desc_1), bVar2) {
      local_238 = &__gnu_cxx::
                   __normal_iterator<const_wabt::interp::TableDesc_*,_std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>_>
                   ::operator*(&__end2_1)->type;
      pIVar11 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      TableType::TableType((TableType *)&__range2_2,local_238);
      Table::New(&local_258,(Store *)this,(TableType *)&__range2_2);
      local_240.index = (size_t)RefPtr<wabt::interp::Table>::ref(&local_258);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (&pIVar11->tables_,&local_240);
      RefPtr<wabt::interp::Table>::~RefPtr(&local_258);
      TableType::~TableType((TableType *)&__range2_2);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::TableDesc_*,_std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>_>
      ::operator++(&__end2_1);
    }
    pMVar4 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar5 = Module::desc(pMVar4);
    __end2_2 = std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>::
               begin(&pMVar5->memories);
    desc_2 = (MemoryDesc *)
             std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>::end
                       (&pMVar5->memories);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<const_wabt::interp::MemoryDesc_*,_std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>_>
                               *)&desc_2), bVar2) {
      local_2a0 = &__gnu_cxx::
                   __normal_iterator<const_wabt::interp::MemoryDesc_*,_std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>_>
                   ::operator*(&__end2_2)->type;
      pIVar11 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      MemoryType::MemoryType((MemoryType *)&__range2_3,local_2a0);
      Memory::New(&local_2c0,(Store *)this,(MemoryType *)&__range2_3);
      local_2a8.index = (size_t)RefPtr<wabt::interp::Memory>::ref(&local_2c0);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (&pIVar11->memories_,&local_2a8);
      RefPtr<wabt::interp::Memory>::~RefPtr(&local_2c0);
      MemoryType::~MemoryType((MemoryType *)&__range2_3);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::MemoryDesc_*,_std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>_>
      ::operator++(&__end2_2);
    }
    pMVar4 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar5 = Module::desc(pMVar4);
    __end2_3 = std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>::
               begin(&pMVar5->globals);
    desc_3 = (GlobalDesc *)
             std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>::end
                       (&pMVar5->globals);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_3,
                              (__normal_iterator<const_wabt::interp::GlobalDesc_*,_std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>_>
                               *)&desc_3), bVar2) {
      local_340._56_8_ =
           __gnu_cxx::
           __normal_iterator<const_wabt::interp::GlobalDesc_*,_std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>_>
           ::operator*(&__end2_3);
      pIVar11 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      GlobalType::GlobalType((GlobalType *)local_340,(GlobalType *)local_340._56_8_);
      this_00 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      VVar19 = ResolveInitExpr(this_00,(Store *)this,*(InitExpr *)(local_340._56_8_ + 0x18));
      local_350 = (GlobalType *)VVar19.i64_;
      local_348 = VVar19._8_8_;
      VVar19._8_8_ = out_trap;
      VVar19.i64_ = local_348;
      Global::New((Ptr *)(local_340 + 0x18),(Global *)this,(Store *)local_340,local_350,VVar19);
      local_340._48_8_ =
           RefPtr<wabt::interp::Global>::ref((RefPtr<wabt::interp::Global> *)(local_340 + 0x18));
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (&pIVar11->globals_,(value_type *)(local_340 + 0x30));
      RefPtr<wabt::interp::Global>::~RefPtr((RefPtr<wabt::interp::Global> *)(local_340 + 0x18));
      GlobalType::~GlobalType((GlobalType *)local_340);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::GlobalDesc_*,_std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>_>
      ::operator++(&__end2_3);
    }
    pMVar4 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar5 = Module::desc(pMVar4);
    __end2_4 = std::vector<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>::begin
                         (&pMVar5->events);
    desc_4 = (EventDesc *)
             std::vector<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>::end
                       (&pMVar5->events);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_4,
                              (__normal_iterator<const_wabt::interp::EventDesc_*,_std::vector<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>_>
                               *)&desc_4), bVar2) {
      local_388 = &__gnu_cxx::
                   __normal_iterator<const_wabt::interp::EventDesc_*,_std::vector<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>_>
                   ::operator*(&__end2_4)->type;
      pIVar11 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      EventType::EventType((EventType *)&__range2_5,local_388);
      Event::New(&local_3a8,(Store *)this,(EventType *)&__range2_5);
      local_390.index = (size_t)RefPtr<wabt::interp::Event>::ref(&local_3a8);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (&pIVar11->events_,&local_390);
      RefPtr<wabt::interp::Event>::~RefPtr(&local_3a8);
      EventType::~EventType((EventType *)&__range2_5);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::EventDesc_*,_std::vector<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>_>
      ::operator++(&__end2_4);
    }
    pMVar4 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar5 = Module::desc(pMVar4);
    __end2_5 = std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>::
               begin(&pMVar5->exports);
    desc_5 = (ExportDesc *)
             std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>::end
                       (&pMVar5->exports);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_5,
                              (__normal_iterator<const_wabt::interp::ExportDesc_*,_std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>_>
                               *)&desc_5), bVar2) {
      ref.index = (size_t)__gnu_cxx::
                          __normal_iterator<const_wabt::interp::ExportDesc_*,_std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>_>
                          ::operator*(&__end2_5);
      pEVar12 = std::
                unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                ::operator->(&(((reference)ref.index)->type).type);
      switch(pEVar12->kind) {
      case First:
        pIVar11 = RefPtr<wabt::interp::Instance>::operator->
                            ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
        pvVar17 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                            (&pIVar11->funcs_,(ulong)*(uint *)(ref.index + 0x28));
        __range2_6 = (vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_> *)
                     pvVar17->index;
        break;
      case Table:
        pIVar11 = RefPtr<wabt::interp::Instance>::operator->
                            ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
        pvVar17 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                            (&pIVar11->tables_,(ulong)*(uint *)(ref.index + 0x28));
        __range2_6 = (vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_> *)
                     pvVar17->index;
        break;
      case Memory:
        pIVar11 = RefPtr<wabt::interp::Instance>::operator->
                            ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
        pvVar17 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                            (&pIVar11->memories_,(ulong)*(uint *)(ref.index + 0x28));
        __range2_6 = (vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_> *)
                     pvVar17->index;
        break;
      case Global:
        pIVar11 = RefPtr<wabt::interp::Instance>::operator->
                            ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
        pvVar17 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                            (&pIVar11->globals_,(ulong)*(uint *)(ref.index + 0x28));
        __range2_6 = (vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_> *)
                     pvVar17->index;
        break;
      case Event:
        pIVar11 = RefPtr<wabt::interp::Instance>::operator->
                            ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
        pvVar17 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                            (&pIVar11->events_,(ulong)*(uint *)(ref.index + 0x28));
        __range2_6 = (vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_> *)
                     pvVar17->index;
      }
      pIVar11 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (&pIVar11->exports_,(value_type *)&__range2_6);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::ExportDesc_*,_std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>_>
      ::operator++(&__end2_5);
    }
    pMVar4 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar5 = Module::desc(pMVar4);
    __end2_6 = std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>::begin
                         (&pMVar5->elems);
    desc_6 = (ElemDesc *)
             std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>::end
                       (&pMVar5->elems);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_6,
                              (__normal_iterator<const_wabt::interp::ElemDesc_*,_std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>_>
                               *)&desc_6), bVar2) {
      local_418 = __gnu_cxx::
                  __normal_iterator<const_wabt::interp::ElemDesc_*,_std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>_>
                  ::operator*(&__end2_6);
      pIVar11 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      __range2_7 = (vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_> *)
                   local_418;
      std::vector<wabt::interp::ElemSegment,std::allocator<wabt::interp::ElemSegment>>::
      emplace_back<wabt::interp::ElemDesc_const*,wabt::interp::RefPtr<wabt::interp::Instance>&>
                ((vector<wabt::interp::ElemSegment,std::allocator<wabt::interp::ElemSegment>> *)
                 &pIVar11->elems_,(ElemDesc **)&__range2_7,
                 (RefPtr<wabt::interp::Instance> *)&import_desc_count);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::ElemDesc_*,_std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>_>
      ::operator++(&__end2_6);
    }
    pMVar4 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar5 = Module::desc(pMVar4);
    __end2_7 = std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>::begin
                         (&pMVar5->datas);
    desc_7 = (DataDesc *)
             std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>::end
                       (&pMVar5->datas);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_7,
                              (__normal_iterator<const_wabt::interp::DataDesc_*,_std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>_>
                               *)&desc_7), bVar2) {
      local_440 = __gnu_cxx::
                  __normal_iterator<const_wabt::interp::DataDesc_*,_std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>_>
                  ::operator*(&__end2_7);
      pIVar11 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      pDStack_448 = local_440;
      std::vector<wabt::interp::DataSegment,std::allocator<wabt::interp::DataSegment>>::
      emplace_back<wabt::interp::DataDesc_const*>
                ((vector<wabt::interp::DataSegment,std::allocator<wabt::interp::DataSegment>> *)
                 &pIVar11->datas_,&stack0xfffffffffffffbb8);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::DataDesc_*,_std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>_>
      ::operator++(&__end2_7);
    }
    this_01 = Store::features((Store *)this);
    bVar2 = Features::bulk_memory_enabled(this_01);
    for (__range3._4_4_ = (uint)bVar2; (int)__range3._4_4_ < 2; __range3._4_4_ = __range3._4_4_ + 1)
    {
      pIVar11 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      __end3 = std::vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>::
               begin(&pIVar11->elems_);
      segment = (ElemSegment *)
                std::vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>::
                end(&pIVar11->elems_);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<wabt::interp::ElemSegment_*,_std::vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>_>
                                         *)&segment), bVar2) {
        this_02 = __gnu_cxx::
                  __normal_iterator<wabt::interp::ElemSegment_*,_std::vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>_>
                  ::operator*(&__end3);
        pEVar13 = ElemSegment::desc(this_02);
        if (pEVar13->mode == Active) {
          Result::Result((Result *)((long)&table.root_index_ + 4));
          pIVar11 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          pvVar17 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                              (&pIVar11->tables_,(ulong)pEVar13->table_index);
          RStack_4a0.index = pvVar17->index;
          RefPtr<wabt::interp::Table>::RefPtr
                    ((RefPtr<wabt::interp::Table> *)local_498,(Store *)this,RStack_4a0);
          pIVar11 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          local_4d0 = *(undefined8 *)&pEVar13->offset;
          local_4c8 = (pEVar13->offset).field_1.i64_;
          local_4c0 = *(undefined8 *)((long)&(pEVar13->offset).field_1 + 8);
          local_4b8 = ResolveInitExpr(pIVar11,(Store *)this,pEVar13->offset);
          local_4a4 = Value::Get<unsigned_int>((Value *)&local_4b8.v128_);
          if (__range3._4_4_ == 0) {
            pTVar14 = RefPtr<wabt::interp::Table>::operator->
                                ((RefPtr<wabt::interp::Table> *)local_498);
            uVar1 = local_4a4;
            uVar3 = ElemSegment::size(this_02);
            bVar2 = Table::IsValidRange(pTVar14,uVar1,uVar3);
            Result::Result(&local_4d4,(uint)!bVar2);
            table.root_index_._4_4_ = local_4d4.enum_;
          }
          else {
            pTVar14 = RefPtr<wabt::interp::Table>::operator->
                                ((RefPtr<wabt::interp::Table> *)local_498);
            uVar1 = local_4a4;
            uVar3 = ElemSegment::size(this_02);
            local_4d8 = (Enum)Table::Init(pTVar14,(Store *)this,uVar1,this_02,0,uVar3);
            table.root_index_._4_4_ = (Result)local_4d8;
            ElemSegment::Drop(this_02);
          }
          local_4dc = table.root_index_._4_4_;
          bVar2 = Failed(table.root_index_._4_4_);
          uVar1 = local_4a4;
          if (bVar2) {
            uVar15 = (ulong)local_4a4;
            uVar3 = ElemSegment::size(this_02);
            pTVar14 = RefPtr<wabt::interp::Table>::operator->
                                ((RefPtr<wabt::interp::Table> *)local_498);
            Table::size(pTVar14);
            StringPrintf_abi_cxx11_
                      (&local_518,
                       "out of bounds table access: elem segment is out of bounds: [%u, %lu) >= max value %u"
                       ,(ulong)uVar1,uVar15 + uVar3);
            memset(&__range3_1,0,0x18);
            std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::vector
                      ((vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                       &__range3_1);
            Trap::New(&local_4f8,(Store *)this,&local_518,
                      (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                      &__range3_1);
            RefPtr<wabt::interp::Trap>::operator=
                      ((RefPtr<wabt::interp::Trap> *)mod.root_index_,&local_4f8);
            RefPtr<wabt::interp::Trap>::~RefPtr(&local_4f8);
            std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::~vector
                      ((vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                       &__range3_1);
            std::__cxx11::string::~string((string *)&local_518);
            RefPtr<wabt::interp::Instance>::RefPtr(__return_storage_ptr__);
          }
          RefPtr<wabt::interp::Table>::~RefPtr((RefPtr<wabt::interp::Table> *)local_498);
          if (bVar2) goto LAB_0045f16b;
        }
        else if (pEVar13->mode == Declared) {
          ElemSegment::Drop(this_02);
        }
        __gnu_cxx::
        __normal_iterator<wabt::interp::ElemSegment_*,_std::vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>_>
        ::operator++(&__end3);
      }
      pIVar11 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      __end3_1 = std::vector<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>
                 ::begin(&pIVar11->datas_);
      segment_1 = (DataSegment *)
                  std::vector<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>
                  ::end(&pIVar11->datas_);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<wabt::interp::DataSegment_*,_std::vector<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>_>
                                 *)&segment_1), bVar2) {
        this_03 = __gnu_cxx::
                  __normal_iterator<wabt::interp::DataSegment_*,_std::vector<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>_>
                  ::operator*(&__end3_1);
        pDVar16 = DataSegment::desc(this_03);
        if (pDVar16->mode == Active) {
          Result::Result((Result *)((long)&memory.root_index_ + 4));
          pIVar11 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          pvVar17 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                              (&pIVar11->memories_,(ulong)pDVar16->memory_index);
          RStack_580.index = pvVar17->index;
          RefPtr<wabt::interp::Memory>::RefPtr
                    ((RefPtr<wabt::interp::Memory> *)local_578,(Store *)this,RStack_580);
          pIVar11 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          local_5b0 = *(undefined8 *)&pDVar16->offset;
          local_5a8 = (pDVar16->offset).field_1.i64_;
          local_5a0 = *(undefined8 *)((long)&(pDVar16->offset).field_1 + 8);
          local_598 = ResolveInitExpr(pIVar11,(Store *)this,pDVar16->offset);
          local_584 = Value::Get<unsigned_int>((Value *)&local_598.v128_);
          if (__range3._4_4_ == 0) {
            pMVar18 = RefPtr<wabt::interp::Memory>::operator->
                                ((RefPtr<wabt::interp::Memory> *)local_578);
            uVar1 = local_584;
            uVar3 = DataSegment::size(this_03);
            bVar2 = Memory::IsValidAccess(pMVar18,uVar1,0,(ulong)uVar3);
            Result::Result(&local_5b4,(uint)!bVar2);
            memory.root_index_._4_4_ = local_5b4.enum_;
          }
          else {
            pMVar18 = RefPtr<wabt::interp::Memory>::operator->
                                ((RefPtr<wabt::interp::Memory> *)local_578);
            uVar1 = local_584;
            uVar3 = DataSegment::size(this_03);
            local_5b8 = (Enum)Memory::Init(pMVar18,uVar1,this_03,0,uVar3);
            memory.root_index_._4_4_ = (Result)local_5b8;
            DataSegment::Drop(this_03);
          }
          local_5bc = memory.root_index_._4_4_;
          bVar2 = Failed(memory.root_index_._4_4_);
          uVar1 = local_584;
          if (bVar2) {
            uVar15 = (ulong)local_584;
            uVar3 = DataSegment::size(this_03);
            pMVar18 = RefPtr<wabt::interp::Memory>::operator->
                                ((RefPtr<wabt::interp::Memory> *)local_578);
            Memory::ByteSize(pMVar18);
            StringPrintf_abi_cxx11_
                      (&local_5f8,
                       "out of bounds memory access: data segment is out of bounds: [%u, %lu) >= max value %u"
                       ,(ulong)uVar1,uVar15 + uVar3);
            memset(&__range2_8,0,0x18);
            std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::vector
                      ((vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                       &__range2_8);
            Trap::New(&local_5d8,(Store *)this,&local_5f8,
                      (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                      &__range2_8);
            RefPtr<wabt::interp::Trap>::operator=
                      ((RefPtr<wabt::interp::Trap> *)mod.root_index_,&local_5d8);
            RefPtr<wabt::interp::Trap>::~RefPtr(&local_5d8);
            std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::~vector
                      ((vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                       &__range2_8);
            std::__cxx11::string::~string((string *)&local_5f8);
            RefPtr<wabt::interp::Instance>::RefPtr(__return_storage_ptr__);
          }
          RefPtr<wabt::interp::Memory>::~RefPtr((RefPtr<wabt::interp::Memory> *)local_578);
          if (bVar2) goto LAB_0045f16b;
        }
        else if (pDVar16->mode == Declared) {
          DataSegment::Drop(this_03);
        }
        __gnu_cxx::
        __normal_iterator<wabt::interp::DataSegment_*,_std::vector<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>_>
        ::operator++(&__end3_1);
      }
    }
    pMVar4 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar5 = Module::desc(pMVar4);
    __end2_8 = std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>::begin
                         (&pMVar5->starts);
    start = (StartDesc *)
            std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>::end
                      (&pMVar5->starts);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_8,
                              (__normal_iterator<const_wabt::interp::StartDesc_*,_std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>_>
                               *)&start), bVar2) {
      func.root_index_ =
           (Index)__gnu_cxx::
                  __normal_iterator<const_wabt::interp::StartDesc_*,_std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>_>
                  ::operator*(&__end2_8);
      pIVar11 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      pvVar17 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                          (&pIVar11->funcs_,(ulong)*(uint *)func.root_index_);
      results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pvVar17->index;
      RefPtr<wabt::interp::Func>::RefPtr
                ((RefPtr<wabt::interp::Func> *)local_648,(Store *)this,
                 (Ref)results.
                      super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector
                ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)local_668);
      this_04 = RefPtr<wabt::interp::Func>::operator->((RefPtr<wabt::interp::Func> *)local_648);
      memset(&local_688,0,0x18);
      std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector(&local_688);
      local_66c = (Enum)Func::Call(this_04,(Store *)this,&local_688,(Values *)local_668,
                                   (Ptr *)mod.root_index_,(Stream *)0x0);
      bVar2 = Failed((Result)local_66c);
      std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector(&local_688);
      if (bVar2) {
        RefPtr<wabt::interp::Instance>::RefPtr(__return_storage_ptr__);
      }
      std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector
                ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)local_668);
      RefPtr<wabt::interp::Func>::~RefPtr((RefPtr<wabt::interp::Func> *)local_648);
      if (bVar2) goto LAB_0045f16b;
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::StartDesc_*,_std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>_>
      ::operator++(&__end2_8);
    }
    RefPtr<wabt::interp::Instance>::RefPtr
              (__return_storage_ptr__,(RefPtr<wabt::interp::Instance> *)&import_desc_count);
  }
LAB_0045f16b:
  RefPtr<wabt::interp::Instance>::~RefPtr((RefPtr<wabt::interp::Instance> *)&import_desc_count);
  RefPtr<wabt::interp::Module>::~RefPtr((RefPtr<wabt::interp::Module> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Instance::Ptr Instance::Instantiate(Store& store,
                                    Ref module,
                                    const RefVec& imports,
                                    Trap::Ptr* out_trap) {
  Module::Ptr mod{store, module};
  Instance::Ptr inst = store.Alloc<Instance>(store, module);

  size_t import_desc_count = mod->desc().imports.size();
  if (imports.size() < import_desc_count) {
    *out_trap = Trap::New(store, "not enough imports!");
    return {};
  }

  // Imports.
  for (size_t i = 0; i < import_desc_count; ++i) {
    auto&& import_desc = mod->desc().imports[i];
    Ref extern_ref = imports[i];
    if (extern_ref == Ref::Null) {
      *out_trap = Trap::New(store, StringPrintf("invalid import \"%s.%s\"",
                                                import_desc.type.module.c_str(),
                                                import_desc.type.name.c_str()));
      return {};
    }

    Extern::Ptr extern_{store, extern_ref};
    if (Failed(extern_->Match(store, import_desc.type, out_trap))) {
      return {};
    }

    inst->imports_.push_back(extern_ref);

    switch (import_desc.type.type->kind) {
      case ExternKind::Func:   inst->funcs_.push_back(extern_ref); break;
      case ExternKind::Table:  inst->tables_.push_back(extern_ref); break;
      case ExternKind::Memory: inst->memories_.push_back(extern_ref); break;
      case ExternKind::Global: inst->globals_.push_back(extern_ref); break;
      case ExternKind::Event:  inst->events_.push_back(extern_ref); break;
    }
  }

  // Funcs.
  for (auto&& desc : mod->desc().funcs) {
    inst->funcs_.push_back(DefinedFunc::New(store, inst.ref(), desc).ref());
  }

  // Tables.
  for (auto&& desc : mod->desc().tables) {
    inst->tables_.push_back(Table::New(store, desc.type).ref());
  }

  // Memories.
  for (auto&& desc : mod->desc().memories) {
    inst->memories_.push_back(Memory::New(store, desc.type).ref());
  }

  // Globals.
  for (auto&& desc : mod->desc().globals) {
    inst->globals_.push_back(
        Global::New(store, desc.type, inst->ResolveInitExpr(store, desc.init))
            .ref());
  }

  // Events.
  for (auto&& desc : mod->desc().events) {
    inst->events_.push_back(Event::New(store, desc.type).ref());
  }

  // Exports.
  for (auto&& desc : mod->desc().exports){
    Ref ref;
    switch (desc.type.type->kind) {
      case ExternKind::Func:   ref = inst->funcs_[desc.index]; break;
      case ExternKind::Table:  ref = inst->tables_[desc.index]; break;
      case ExternKind::Memory: ref = inst->memories_[desc.index]; break;
      case ExternKind::Global: ref = inst->globals_[desc.index]; break;
      case ExternKind::Event:  ref = inst->events_[desc.index]; break;
    }
    inst->exports_.push_back(ref);
  }

  // Elems.
  for (auto&& desc : mod->desc().elems) {
    inst->elems_.emplace_back(&desc, inst);
  }

  // Datas.
  for (auto&& desc : mod->desc().datas) {
    inst->datas_.emplace_back(&desc);
  }

  // Initialization.
  enum Pass { Check, Init };
  int pass = store.features().bulk_memory_enabled() ? Init : Check;
  for (; pass <= Init; ++pass) {
    // Elems.
    for (auto&& segment : inst->elems_) {
      auto&& desc = segment.desc();
      if (desc.mode == SegmentMode::Active) {
        Result result;
        Table::Ptr table{store, inst->tables_[desc.table_index]};
        u32 offset = inst->ResolveInitExpr(store, desc.offset).Get<u32>();
        if (pass == Check) {
          result = table->IsValidRange(offset, segment.size()) ? Result::Ok
                                                               : Result::Error;
        } else {
          result = table->Init(store, offset, segment, 0, segment.size());
          segment.Drop();
        }

        if (Failed(result)) {
          *out_trap = Trap::New(
              store, StringPrintf(
                         "out of bounds table access: elem segment is "
                         "out of bounds: [%u, %" PRIu64 ") >= max value %u",
                         offset, u64{offset} + segment.size(), table->size()));
          return {};
        }
      } else if (desc.mode == SegmentMode::Declared) {
        segment.Drop();
      }
    }

    // Data.
    for (auto&& segment : inst->datas_) {
      auto&& desc = segment.desc();
      if (desc.mode == SegmentMode::Active) {
        Result result;
        Memory::Ptr memory{store, inst->memories_[desc.memory_index]};
        u32 offset = inst->ResolveInitExpr(store, desc.offset).Get<u32>();
        if (pass == Check) {
          result = memory->IsValidAccess(offset, 0, segment.size())
                       ? Result::Ok
                       : Result::Error;
        } else {
          result = memory->Init(offset, segment, 0, segment.size());
          segment.Drop();
        }

        if (Failed(result)) {
          *out_trap = Trap::New(
              store,
              StringPrintf("out of bounds memory access: data segment is "
                           "out of bounds: [%u, %" PRIu64 ") >= max value %u",
                           offset, u64{offset} + segment.size(),
                           memory->ByteSize()));
          return {};
        }
      } else if (desc.mode == SegmentMode::Declared) {
        segment.Drop();
      }
    }
  }

  // Start.
  for (auto&& start : mod->desc().starts) {
    Func::Ptr func{store, inst->funcs_[start.func_index]};
    Values results;
    if (Failed(func->Call(store, {}, results, out_trap))) {
      return {};
    }
  }

  return inst;
}